

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalOperator::GetLocalSinkState(PhysicalOperator *this,ExecutionContext *context)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x30);
  *pp_Var1 = (_func_int *)&PTR__LocalSinkState_0243f6a8;
  *(undefined4 *)(pp_Var1 + 1) = 0xffffffff;
  *(undefined4 *)((long)pp_Var1 + 0xc) = 0xffffffff;
  *(undefined4 *)(pp_Var1 + 2) = 0xffffffff;
  *(undefined4 *)((long)pp_Var1 + 0x14) = 0xffffffff;
  *(undefined1 (*) [16])(pp_Var1 + 3) = (undefined1  [16])0x0;
  pp_Var1[5] = (_func_int *)0x0;
  this->_vptr_PhysicalOperator = pp_Var1;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalOperator::GetLocalSinkState(ExecutionContext &context) const {
	return make_uniq<LocalSinkState>();
}